

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

string * __thiscall
cmCTestGIT::FindTopDir_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  bool bVar1;
  string cdup;
  char *git_rev_parse [4];
  OutputLogger rev_parse_err;
  OneLineParser rev_parse_out;
  string local_f8;
  pointer local_d8;
  char *local_d0;
  char *local_c8;
  undefined8 local_c0;
  string local_b8;
  LineParser local_98;
  OneLineParser local_58;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory);
  local_d8 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_d0 = "rev-parse";
  local_c8 = "--show-cdup";
  local_c0 = 0;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  OneLineParser::OneLineParser(&local_58,this,"rev-parse-out> ",&local_f8);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&local_98,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "rev-parse-err> ");
  bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,&local_d8,(OutputParser *)&local_58,
                              &local_98.super_OutputParser,(char *)0x0);
  if (bVar1 && local_f8._M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    cmsys::SystemTools::CollapseFullPath(&local_b8,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  cmProcessTools::LineParser::~LineParser(&local_98);
  cmProcessTools::LineParser::~LineParser(&local_58.super_LineParser);
  std::__cxx11::string::~string((string *)&local_f8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::FindTopDir()
{
  std::string top_dir = this->SourceDirectory;

  // Run "git rev-parse --show-cdup" to locate the top of the tree.
  const char* git = this->CommandLineTool.c_str();
  char const* git_rev_parse[] = {git, "rev-parse", "--show-cdup", 0};
  std::string cdup;
  OneLineParser rev_parse_out(this, "rev-parse-out> ", cdup);
  OutputLogger rev_parse_err(this->Log, "rev-parse-err> ");
  if(this->RunChild(git_rev_parse, &rev_parse_out, &rev_parse_err) &&
     !cdup.empty())
    {
    top_dir += "/";
    top_dir += cdup;
    top_dir = cmSystemTools::CollapseFullPath(top_dir);
    }
  return top_dir;
}